

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
 (anonymous_namespace)::
 BuildHighbdLumaParams<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,ConvolveParams*,int)>
           (_func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int
            *test_func)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
  PVar1;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
  *this;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
  *in_stack_ffffffffffffffc8;
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
  local_28;
  
  this = &local_28;
  GetHighbdLumaTestParams<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,ConvolveParams*,int)>
            ((_func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_ConvolveParams_ptr_int
              *)in_stack_ffffffffffffffc8);
  testing::
  ValuesIn<std::vector<(anonymous_namespace)::TestParam<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,ConvolveParams*,int)>,std::allocator<(anonymous_namespace)::TestParam<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,ConvolveParams*,int)>>>>
            (in_stack_ffffffffffffffc8);
  std::
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>_>
  ::~vector(this);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

::testing::internal::ParamGenerator<TestParam<T>> BuildHighbdLumaParams(
    T test_func) {
  return ::testing::ValuesIn(GetHighbdLumaTestParams(test_func));
}